

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O3

void Ivy_FraigAddClausesMux(Ivy_FraigMan_t *p,Ivy_Obj_t *pNode)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Ivy_Obj_t *pIVar5;
  uint uVar6;
  uint uVar7;
  int pLits [4];
  Ivy_Obj_t *pNodeE;
  Ivy_Obj_t *pNodeT;
  uint local_68;
  uint local_64;
  uint local_60;
  lit local_5c;
  uint local_58;
  uint local_54;
  ulong local_50;
  ulong local_48;
  Ivy_Obj_t *local_40;
  Ivy_Obj_t *local_38;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Ivy_IsComplement( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFraig.c"
                  ,0x935,"void Ivy_FraigAddClausesMux(Ivy_FraigMan_t *, Ivy_Obj_t *)");
  }
  iVar3 = Ivy_ObjIsMuxType(pNode);
  if (iVar3 == 0) {
    __assert_fail("Ivy_ObjIsMuxType( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFraig.c"
                  ,0x936,"void Ivy_FraigAddClausesMux(Ivy_FraigMan_t *, Ivy_Obj_t *)");
  }
  pIVar5 = Ivy_ObjRecognizeMux(pNode,&local_38,&local_40);
  iVar3 = *(int *)&pIVar5->pNextFan0;
  uVar2 = *(uint *)(((ulong)local_38 & 0xfffffffffffffffe) + 0x28);
  local_48 = (ulong)uVar2;
  local_50 = (ulong)*(uint *)(((ulong)local_40 & 0xfffffffffffffffe) + 0x28);
  uVar1 = iVar3 * 2 + 1;
  uVar6 = ((uint)local_38 & 1) + uVar2 * 2;
  local_64 = uVar6 ^ 1;
  uVar2 = *(int *)&pNode->pNextFan0 * 2;
  local_68 = uVar1;
  local_60 = uVar2;
  local_54 = local_64;
  iVar4 = sat_solver_addclause(p->pSat,(lit *)&local_68,&local_5c);
  if (iVar4 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFraig.c"
                  ,0x94e,"void Ivy_FraigAddClausesMux(Ivy_FraigMan_t *, Ivy_Obj_t *)");
  }
  uVar7 = uVar2 | 1;
  local_68 = uVar1;
  local_64 = uVar6;
  local_60 = uVar7;
  local_58 = uVar6;
  iVar4 = sat_solver_addclause(p->pSat,(lit *)&local_68,&local_5c);
  if (iVar4 != 0) {
    uVar1 = iVar3 * 2;
    uVar6 = ((uint)local_40 & 1) + (int)local_50 * 2;
    local_68 = uVar1;
    local_64 = uVar6 ^ 1;
    local_60 = uVar2;
    iVar3 = sat_solver_addclause(p->pSat,(lit *)&local_68,&local_5c);
    if (iVar3 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFraig.c"
                    ,0x958,"void Ivy_FraigAddClausesMux(Ivy_FraigMan_t *, Ivy_Obj_t *)");
    }
    local_68 = uVar1;
    local_64 = uVar6;
    local_60 = uVar7;
    iVar3 = sat_solver_addclause(p->pSat,(lit *)&local_68,&local_5c);
    if (iVar3 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFraig.c"
                    ,0x95d,"void Ivy_FraigAddClausesMux(Ivy_FraigMan_t *, Ivy_Obj_t *)");
    }
    if ((int)local_48 != (int)local_50) {
      local_68 = local_58;
      local_64 = uVar6;
      local_60 = uVar7;
      iVar3 = sat_solver_addclause(p->pSat,(lit *)&local_68,&local_5c);
      if (iVar3 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFraig.c"
                      ,0x970,"void Ivy_FraigAddClausesMux(Ivy_FraigMan_t *, Ivy_Obj_t *)");
      }
      local_68 = local_54;
      local_64 = uVar6 ^ 1;
      local_60 = uVar2;
      iVar3 = sat_solver_addclause(p->pSat,(lit *)&local_68,&local_5c);
      if (iVar3 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFraig.c"
                      ,0x975,"void Ivy_FraigAddClausesMux(Ivy_FraigMan_t *, Ivy_Obj_t *)");
      }
    }
    return;
  }
  __assert_fail("RetValue",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFraig.c"
                ,0x953,"void Ivy_FraigAddClausesMux(Ivy_FraigMan_t *, Ivy_Obj_t *)");
}

Assistant:

void Ivy_FraigAddClausesMux( Ivy_FraigMan_t * p, Ivy_Obj_t * pNode )
{
    Ivy_Obj_t * pNodeI, * pNodeT, * pNodeE;
    int pLits[4], RetValue, VarF, VarI, VarT, VarE, fCompT, fCompE;

    assert( !Ivy_IsComplement( pNode ) );
    assert( Ivy_ObjIsMuxType( pNode ) );
    // get nodes (I = if, T = then, E = else)
    pNodeI = Ivy_ObjRecognizeMux( pNode, &pNodeT, &pNodeE );
    // get the variable numbers
    VarF = Ivy_ObjSatNum(pNode);
    VarI = Ivy_ObjSatNum(pNodeI);
    VarT = Ivy_ObjSatNum(Ivy_Regular(pNodeT));
    VarE = Ivy_ObjSatNum(Ivy_Regular(pNodeE));
    // get the complementation flags
    fCompT = Ivy_IsComplement(pNodeT);
    fCompE = Ivy_IsComplement(pNodeE);

    // f = ITE(i, t, e)

    // i' + t' + f
    // i' + t  + f'
    // i  + e' + f
    // i  + e  + f'

    // create four clauses
    pLits[0] = toLitCond(VarI, 1);
    pLits[1] = toLitCond(VarT, 1^fCompT);
    pLits[2] = toLitCond(VarF, 0);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 1);
    pLits[1] = toLitCond(VarT, 0^fCompT);
    pLits[2] = toLitCond(VarF, 1);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 0);
    pLits[1] = toLitCond(VarE, 1^fCompE);
    pLits[2] = toLitCond(VarF, 0);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 0);
    pLits[1] = toLitCond(VarE, 0^fCompE);
    pLits[2] = toLitCond(VarF, 1);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );

    // two additional clauses
    // t' & e' -> f'
    // t  & e  -> f 

    // t  + e   + f'
    // t' + e'  + f 

    if ( VarT == VarE )
    {
//        assert( fCompT == !fCompE );
        return;
    }

    pLits[0] = toLitCond(VarT, 0^fCompT);
    pLits[1] = toLitCond(VarE, 0^fCompE);
    pLits[2] = toLitCond(VarF, 1);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarT, 1^fCompT);
    pLits[1] = toLitCond(VarE, 1^fCompE);
    pLits[2] = toLitCond(VarF, 0);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
}